

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void Statement_if(KonohaContext *kctx,KonohaStack *sfp)

{
  KClass *pKVar1;
  kNameSpace *pkVar2;
  kNode *pkVar3;
  kNode *pkVar4;
  KonohaStack *in_RSI;
  KonohaContext *in_RDI;
  kNode *thenNode;
  kNode *condNode;
  KClass *reqc;
  kNameSpace *ns;
  kNode *stmt;
  
  pkVar4 = in_RSI[1].field_0.asNode;
  pkVar2 = kNode_GetNameSpace(in_RDI,pkVar4);
  pKVar1 = ((in_RSI[3].field_0.asObject)->h).ct;
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Statement_if",0x399,"tracing..");
  pkVar3 = (*in_RDI->klib->TypeCheckNodeByName)
                     (in_RDI,pkVar4,0xe000000a,pkVar2,
                      *(KClass **)((in_RDI->share->classTable).field_1.bytebuf + 0x18),0);
  if (((pkVar3->nodeType != 0x18) &&
      (pkVar3 = (*in_RDI->klib->TypeCheckNodeByName)(in_RDI,pkVar4,0xe000000b,pkVar2,pKVar1,8),
      pkVar3 != (kNode *)0x0)) && (pkVar3->nodeType != 0x18)) {
    (*in_RDI->klib->TypeCheckNodeByName)
              (in_RDI,pkVar4,0x26,pkVar2,
               *(KClass **)
                ((in_RDI->share->classTable).field_1.bytebuf +
                (ulong)(pkVar3->typeAttr & 0xfffffff) * 8),8);
    pkVar4 = kNode_Type(pkVar4,0xe,pkVar3->typeAttr);
    in_RSI[-4].field_0.asNode = pkVar4;
    (*in_RDI->klib->CheckSafePoint)(in_RDI,in_RSI,0);
  }
  return;
}

Assistant:

static KMETHOD Statement_if(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(stmt, ns, reqc);
	kNode *condNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_ExprPattern, ns, KClass_Boolean, 0);
	if(!kNode_IsError(condNode)) {
		kNode *thenNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_BlockPattern, ns, reqc, TypeCheckPolicy_AllowEmpty);
		if(thenNode != NULL && !kNode_IsError(thenNode)) {
			KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_else, ns, KClass_(thenNode->typeAttr), TypeCheckPolicy_AllowEmpty);
			KReturn(kNode_Type(stmt, KNode_If, thenNode->typeAttr));
		}
	}
}